

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix44<float> * __thiscall Imath_3_1::Matrix44<float>::inverse(Matrix44<float> *this)

{
  float *in_RSI;
  Matrix44<float> *in_RDI;
  float a;
  float fVar1;
  float fVar2;
  float fVar3;
  int j_1;
  int i_1;
  float mr;
  int j;
  int i;
  float r;
  Matrix44<float> s;
  int local_68;
  int local_64;
  int local_5c;
  int local_58;
  Matrix44<float> local_50;
  
  if ((((in_RSI[3] != 0.0) || (in_RSI[7] != 0.0)) || (in_RSI[0xb] != 0.0)) ||
     (((NAN(in_RSI[0xb]) || (in_RSI[0xf] != 1.0)) || (NAN(in_RSI[0xf]))))) {
    gjInverse(in_RDI);
  }
  else {
    Matrix44(&local_50,in_RSI[5] * in_RSI[10] + -(in_RSI[9] * in_RSI[6]),
             in_RSI[9] * in_RSI[2] + -(in_RSI[1] * in_RSI[10]),
             in_RSI[1] * in_RSI[6] + -(in_RSI[5] * in_RSI[2]),0.0,
             in_RSI[8] * in_RSI[6] + -(in_RSI[4] * in_RSI[10]),
             *in_RSI * in_RSI[10] + -(in_RSI[8] * in_RSI[2]),
             in_RSI[4] * in_RSI[2] + -(*in_RSI * in_RSI[6]),0.0,
             in_RSI[4] * in_RSI[9] + -(in_RSI[8] * in_RSI[5]),
             in_RSI[8] * in_RSI[1] + -(*in_RSI * in_RSI[9]),
             *in_RSI * in_RSI[5] + -(in_RSI[4] * in_RSI[1]),0.0,0.0,0.0,0.0,1.0);
    a = in_RSI[2] * local_50.x[2][0] + *in_RSI * local_50.x[0][0] + in_RSI[1] * local_50.x[1][0];
    fVar1 = abs<float>(a);
    if (fVar1 < 1.0) {
      fVar1 = abs<float>(a);
      fVar2 = std::numeric_limits<float>::min();
      for (local_64 = 0; local_64 < 3; local_64 = local_64 + 1) {
        for (local_68 = 0; local_68 < 3; local_68 = local_68 + 1) {
          fVar3 = abs<float>(local_50.x[local_64][local_68]);
          if (fVar1 / fVar2 <= fVar3) {
            Matrix44(in_RDI);
            return in_RDI;
          }
          local_50.x[local_64][local_68] = local_50.x[local_64][local_68] / a;
        }
      }
    }
    else {
      for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
        for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
          local_50.x[local_58][local_5c] = local_50.x[local_58][local_5c] / a;
        }
      }
    }
    local_50.x[3][0] =
         -in_RSI[0xe] * local_50.x[2][0] +
         -in_RSI[0xc] * local_50.x[0][0] + -(in_RSI[0xd] * local_50.x[1][0]);
    local_50.x[3][1] =
         -in_RSI[0xe] * local_50.x[2][1] +
         -in_RSI[0xc] * local_50.x[0][1] + -(in_RSI[0xd] * local_50.x[1][1]);
    local_50.x[3][2] =
         -in_RSI[0xe] * local_50.x[2][2] +
         -in_RSI[0xc] * local_50.x[0][2] + -(in_RSI[0xd] * local_50.x[1][2]);
    Matrix44(in_RDI,&local_50);
  }
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Matrix44<T>
Matrix44<T>::inverse() const IMATH_NOEXCEPT
{
    if (x[0][3] != 0 || x[1][3] != 0 || x[2][3] != 0 || x[3][3] != 1)
        return gjInverse();

    Matrix44 s (x[1][1] * x[2][2] - x[2][1] * x[1][2],
                x[2][1] * x[0][2] - x[0][1] * x[2][2],
                x[0][1] * x[1][2] - x[1][1] * x[0][2],
                0,

                x[2][0] * x[1][2] - x[1][0] * x[2][2],
                x[0][0] * x[2][2] - x[2][0] * x[0][2],
                x[1][0] * x[0][2] - x[0][0] * x[1][2],
                0,

                x[1][0] * x[2][1] - x[2][0] * x[1][1],
                x[2][0] * x[0][1] - x[0][0] * x[2][1],
                x[0][0] * x[1][1] - x[1][0] * x[0][1],
                0,

                0,
                0,
                0,
                1);

    T r = x[0][0] * s.x[0][0] + x[0][1] * s.x[1][0] + x[0][2] * s.x[2][0];

    if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
    {
        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                s.x[i][j] /= r;
            }
        }
    }
    else
    {
        T mr = IMATH_INTERNAL_NAMESPACE::abs (r) / std::numeric_limits<T>::min();

        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                if (mr > IMATH_INTERNAL_NAMESPACE::abs (s.x[i][j]))
                {
                    s.x[i][j] /= r;
                }
                else
                {
                    return Matrix44();
                }
            }
        }
    }

    s.x[3][0] = -x[3][0] * s.x[0][0] - x[3][1] * s.x[1][0] - x[3][2] * s.x[2][0];
    s.x[3][1] = -x[3][0] * s.x[0][1] - x[3][1] * s.x[1][1] - x[3][2] * s.x[2][1];
    s.x[3][2] = -x[3][0] * s.x[0][2] - x[3][1] * s.x[1][2] - x[3][2] * s.x[2][2];

    return s;
}